

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::GetPropertyNames
          (tydra *this,Prim *prim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_prop_names,string *err)

{
  bool bVar1;
  int iVar2;
  Model *model;
  ostream *poVar3;
  GPrim *gprim;
  Scope *scope;
  GeomMesh *mesh;
  GeomSubset *pGVar4;
  undefined1 rel_prop;
  undefined7 uVar5;
  ostringstream ss_e;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  rel_prop = SUB81(err,0);
  uVar5 = (undefined7)((ulong)err >> 8);
  if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
     (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x401)) {
    if ((*(undefined8 **)(this + 0x2a8) != (undefined8 *)0x0) &&
       (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 == 0x404)) {
      bVar1 = false;
      gprim = &tinyusdz::value::Value::as<tinyusdz::Xform>((Value *)(this + 0x298),false)->
               super_GPrim;
      if (prim != (Prim *)0x0) {
        bVar1 = anon_unknown_6::GetGPrimPropertyNamesImpl
                          (gprim,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)prim,true,(bool)rel_prop);
      }
      if (bVar1 != false) {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GetPropertyNames",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7b1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Failed to list up Property names of Prim type {}","");
      local_1c8.field_2._M_allocated_capacity._0_6_ = 0x6d726f6658;
      local_1c8._M_string_length = 5;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      fmt::format<std::__cxx11::string>
                (&local_208,(fmt *)local_1e8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(uVar5,rel_prop));
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if (out_prop_names !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)out_prop_names,(ulong)local_208._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                   local_208.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
      return false;
    }
    if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
       (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x402)) {
      if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
         (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x405)) {
        if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
           (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x40e)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"GetPropertyNames",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7bd);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"TODO: Prim type ",0x10);
          if (*(long *)(this + 0x2a8) == 0) {
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            local_208.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
            local_208._M_string_length = 4;
            local_208.field_2._M_allocated_capacity._4_4_ =
                 local_208.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          }
          else {
            (**(code **)(*(long *)(this + 0x2a8) + 0x10))(&local_208);
          }
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                     local_208.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if (out_prop_names !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)out_prop_names,(ulong)local_208._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                       local_208.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          return false;
        }
        pGVar4 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>((Value *)(this + 0x298),false);
        if (prim != (Prim *)0x0) {
          if (((((pGVar4->elementType)._empty != false) ||
               ((pGVar4->elementType)._attrib.has_value_ != false)) ||
              ((pGVar4->elementType)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               (pGVar4->elementType)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start)) || ((pGVar4->elementType)._blocked == true)) {
            local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x6d656c65;
            local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x54746e65;
            local_1a8[0].field_2._8_2_ = 0x7079;
            local_1a8[0].field_2._M_local_buf[10] = 'e';
            local_1a8[0]._M_string_length = 0xb;
            local_1a8[0].field_2._M_local_buf[0xb] = '\0';
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim,
                       local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                                       (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
            }
          }
          if ((((pGVar4->familyName)._attrib.has_value_ != false) ||
              ((pGVar4->familyName)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               (pGVar4->familyName)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start)) ||
             (((pGVar4->familyName)._value_empty != false || ((pGVar4->familyName)._blocked == true)
              ))) {
            local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x696d6166;
            local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x614e796c;
            local_1a8[0].field_2._8_2_ = 0x656d;
            local_1a8[0]._M_string_length = 10;
            local_1a8[0].field_2._M_local_buf[10] = '\0';
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim,
                       local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                                       (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
            }
          }
          if ((((pGVar4->indices)._attrib.has_value_ != false) ||
              ((pGVar4->indices)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               (pGVar4->indices)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start)) ||
             (((pGVar4->indices)._value_empty != false || ((pGVar4->indices)._blocked == true)))) {
            local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x69646e69;
            local_1a8[0]._M_string_length = 7;
            local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x736563;
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim,
                       local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                                       (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
            }
          }
          if (prim != (Prim *)0x0) {
            return true;
          }
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetPropertyNames",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7b4);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_1e8[0] = local_1d8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Failed to list up Property names of Prim type {}","");
        local_1c8.field_2._M_allocated_capacity = 0x736275536d6f6547;
        local_1c8.field_2._8_2_ = 0x7465;
        local_1c8._M_string_length = 10;
        local_1c8.field_2._M_local_buf[10] = '\0';
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        fmt::format<std::__cxx11::string>
                  (&local_208,(fmt *)local_1e8,&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(uVar5,rel_prop));
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                            local_208._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                   local_208.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        if (out_prop_names !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append
                    ((char *)out_prop_names,(ulong)local_208._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                     local_208.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        if (prim == (Prim *)0x0) {
          return false;
        }
        return true;
      }
      mesh = tinyusdz::value::Value::as<tinyusdz::GeomMesh>((Value *)(this + 0x298),false);
      bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
                        (mesh,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)prim,true,(bool)rel_prop);
      if (bVar1) {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GetPropertyNames",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7b3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Failed to list up Property names of Prim type {}","");
      local_1c8._M_string_length = 4;
      local_1c8.field_2._M_allocated_capacity._0_5_ = 0x6873654d;
      goto LAB_004f4695;
    }
    scope = tinyusdz::value::Value::as<tinyusdz::Scope>((Value *)(this + 0x298),false);
    bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Scope>
                      (scope,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)prim,true,(bool)rel_prop);
    if (bVar1) {
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"GetPropertyNames",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7b2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1e8[0] = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Failed to list up Property names of Prim type {}","");
    local_1c8.field_2._M_allocated_capacity._0_6_ = 0x65706f6353;
  }
  else {
    model = tinyusdz::value::Value::as<tinyusdz::Model>((Value *)(this + 0x298),false);
    bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
                      (model,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)prim,true,(bool)rel_prop);
    if (bVar1) {
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"GetPropertyNames",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7b0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1e8[0] = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Failed to list up Property names of Prim type {}","");
    local_1c8.field_2._M_allocated_capacity._0_6_ = 0x6c65646f4d;
  }
  local_1c8._M_string_length = 5;
LAB_004f4695:
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  fmt::format<std::__cxx11::string>
            (&local_208,(fmt *)local_1e8,&local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(uVar5,rel_prop));
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                             local_208.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (out_prop_names !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)out_prop_names,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  if (bVar1 != false) {
    return true;
  }
  return false;
}

Assistant:

bool GetPropertyNames(const tinyusdz::Prim &prim,
                      std::vector<std::string> *out_prop_names,
                      std::string *err) {
#define GET_PRIM_PROPERTY_NAMES(__ty)                                     \
  if (prim.is<__ty>()) {                                                  \
    auto ret = GetPrimPropertyNamesImpl(*prim.as<__ty>(), out_prop_names, \
                                        true, true);                      \
    if (!ret) {                                                           \
      PUSH_ERROR_AND_RETURN(                                              \
          fmt::format("Failed to list up Property names of Prim type {}", \
                      value::TypeTraits<__ty>::type_name()));             \
    }                                                                     \
  } else

  GET_PRIM_PROPERTY_NAMES(Model)
  GET_PRIM_PROPERTY_NAMES(Xform)
  GET_PRIM_PROPERTY_NAMES(Scope)
  GET_PRIM_PROPERTY_NAMES(GeomMesh)
  GET_PRIM_PROPERTY_NAMES(GeomSubset)
  // TODO
  // GET_PRIM_PROPERTY_NAMES(Shader)
  // GET_PRIM_PROPERTY_NAMES(Material)
  // GET_PRIM_PROPERTY_NAMES(SkelRoot)
  // GET_PRIM_PROPERTY_NAMES(BlendShape)
  // GET_PRIM_PROPERTY_NAMES(Skeleton)
  // GET_PRIM_PROPERTY_NAMES(SkelAnimation)
  {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY_NAMES

  return true;
}